

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
          (xpath_ast_node *this,xml_node_struct *ns,undefined8 *xn,undefined8 param_4,byte once)

{
  xml_node_struct *parent;
  xpath_allocator *alloc;
  bool bVar1;
  xpath_allocator *alloc_00;
  xpath_allocator *alloc_01;
  
  parent = (xml_node_struct *)xn[1];
  alloc = (xpath_allocator *)*xn;
  if (alloc == (xpath_allocator *)0x0 || parent != (xml_node_struct *)0x0) {
    if (((parent != (xml_node_struct *)0x0) && (alloc != (xpath_allocator *)0x0)) &&
       (this->_test == '\x02')) {
      step_push((xpath_ast_node *)0x2,(xpath_node_set_raw *)(this->_data).variable,
                (xml_attribute_struct *)ns,parent,alloc);
      return;
    }
  }
  else {
    bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                      (xpath_node_set_raw *)(this->_data).variable,ns,alloc);
    if (((bVar1 & once) == 0) &&
       (alloc_01 = (xpath_allocator *)alloc[1]._root_size, alloc_01 != (xpath_allocator *)0x0)) {
      bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                        (xpath_node_set_raw *)(this->_data).variable,ns,alloc_01);
      while ((bVar1 & once) == 0) {
        alloc_00 = (xpath_allocator *)alloc_01[1]._root_size;
        if (alloc_00 == (xpath_allocator *)0x0) {
          while (alloc_00 = (xpath_allocator *)alloc_01[2]._root, alloc_00 == (xpath_allocator *)0x0
                ) {
            alloc_01 = (xpath_allocator *)alloc_01[1]._root;
            if (alloc_01 == alloc) {
              return;
            }
          }
        }
        bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                          (xpath_node_set_raw *)(this->_data).variable,ns,alloc_00);
        alloc_01 = alloc_00;
      }
    }
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}